

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

value_type * __thiscall QList<QRingChunk>::takeFirst(QList<QRingChunk> *this)

{
  QArrayDataPointer<QRingChunk> *in_RSI;
  QRingChunk *in_RDI;
  value_type *v;
  QRingChunk *in_stack_ffffffffffffffc8;
  QRingChunk *this_00;
  
  this_00 = in_RDI;
  memset(in_RDI,0,0x28);
  ((DataPointer *)&in_RDI->chunk)->d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  ((DataPointer *)&in_RDI->chunk)->ptr = (QRingChunk *)&DAT_aaaaaaaaaaaaaaaa;
  ((DataPointer *)&in_RDI->chunk)->size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  in_RDI->headOffset = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  in_RDI->tailOffset = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  first((QList<QRingChunk> *)this_00);
  QRingChunk::QRingChunk(this_00,in_stack_ffffffffffffffc8);
  QArrayDataPointer<QRingChunk>::operator->(in_RSI);
  QtPrivate::QGenericArrayOps<QRingChunk>::eraseFirst((QGenericArrayOps<QRingChunk> *)this_00);
  return this_00;
}

Assistant:

value_type takeFirst() { Q_ASSERT(!isEmpty()); value_type v = std::move(first()); d->eraseFirst(); return v; }